

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O0

void yyerror(_GREG *G,char *message)

{
  int iVar1;
  bool bVar2;
  int c;
  char *message_local;
  _GREG *G_local;
  
  fprintf(_stderr,"%s:%d: %s",fileName,(ulong)(uint)lineNumber,message);
  if (*G->text != '\0') {
    fprintf(_stderr," near token \'%s\'",G->text);
  }
  if ((G->pos < G->limit) || (iVar1 = feof((FILE *)input), iVar1 == 0)) {
    G->buf[G->limit] = '\0';
    fprintf(_stderr," before text \"");
    while (((G->pos < G->limit && (G->buf[G->pos] != '\n')) && (G->buf[G->pos] != '\r'))) {
      iVar1 = G->pos;
      G->pos = iVar1 + 1;
      fputc((int)G->buf[iVar1],_stderr);
    }
    if (G->pos == G->limit) {
      while( true ) {
        iVar1 = fgetc((FILE *)input);
        bVar2 = false;
        if ((iVar1 != -1) && (bVar2 = false, iVar1 != 10)) {
          bVar2 = iVar1 != 0xd;
        }
        if (!bVar2) break;
        fputc(iVar1,_stderr);
      }
    }
    fputc(0x22,_stderr);
  }
  fprintf(_stderr,"\n");
  exit(1);
}

Assistant:

void yyerror(struct _GREG *G, const char *message)
{
  fprintf(stderr, "%s:%d: %s", fileName, lineNumber, message);
  if (G->text[0]) fprintf(stderr, " near token '%s'", G->text);
  if (G->pos < G->limit || !feof(input))
    {
      G->buf[G->limit]= '\0';
      fprintf(stderr, " before text \"");
      while (G->pos < G->limit)
	{
	  if ('\n' == G->buf[G->pos] || '\r' == G->buf[G->pos]) break;
	  fputc(G->buf[G->pos++], stderr);
	}
      if (G->pos == G->limit)
	{
	  int c;
	  while (EOF != (c= fgetc(input)) && '\n' != c && '\r' != c)
	    fputc(c, stderr);
	}
      fputc('\"', stderr);
    }
  fprintf(stderr, "\n");
  exit(1);
}